

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_loop.c
# Opt level: O0

void loop_subst_snap(jit_State *J,SnapShot *osnap,SnapEntry *loopmap,IRRef1 *subst)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  SnapEntry *pSVar7;
  SnapEntry *pSVar8;
  SnapEntry *pSVar9;
  SnapEntry lsn;
  SnapEntry osn;
  SnapShot *snap;
  BCReg nslots;
  MSize onent;
  MSize nn;
  MSize ln;
  MSize on;
  MSize nmapofs;
  SnapEntry *nextmap;
  SnapEntry *omap;
  SnapEntry *nmap;
  IRRef1 *subst_local;
  SnapEntry *loopmap_local;
  SnapShot *osnap_local;
  jit_State *J_local;
  
  pSVar7 = (J->cur).snapmap;
  uVar3 = osnap->mapofs;
  pSVar8 = (J->cur).snapmap;
  if (osnap + 1 == (J->cur).snap + (J->cur).nsnap) {
    uVar4 = (J->cur).nsnapmap;
  }
  else {
    uVar4 = osnap[1].mapofs;
  }
  bVar1 = osnap->nent;
  bVar2 = osnap->nslots;
  snap = (J->cur).snap + (J->cur).nsnap;
  if (((J->guardemit).irt & 0x80) == 0) {
    snap = snap + -1;
    uVar5 = snap->mapofs;
  }
  else {
    uVar5 = (J->cur).nsnapmap;
    (J->cur).nsnap = (J->cur).nsnap + 1;
  }
  (J->guardemit).irt = '\0';
  snap->mapofs = uVar5;
  snap->ref = (IRRef1)(J->cur).nins;
  snap->nslots = bVar2;
  snap->topslot = osnap->topslot;
  snap->count = '\0';
  pSVar9 = (J->cur).snapmap;
  nn = 0;
  ln = 0;
  on = 0;
  while (on < bVar1) {
    osn = pSVar7[(ulong)uVar3 + (ulong)on];
    uVar6 = loopmap[ln];
    if (uVar6 >> 0x18 < osn >> 0x18) {
      pSVar9[(ulong)uVar5 + (ulong)nn] = uVar6;
      ln = ln + 1;
    }
    else {
      if (uVar6 >> 0x18 == osn >> 0x18) {
        ln = ln + 1;
      }
      if (0x7fff < (osn & 0xffff)) {
        osn = osn & 0xfffb0000 | (uint)subst[osn & 0xffff];
      }
      pSVar9[(ulong)uVar5 + (ulong)nn] = osn;
      on = on + 1;
    }
    nn = nn + 1;
  }
  while (loopmap[ln] >> 0x18 < (uint)bVar2) {
    pSVar9[(ulong)uVar5 + (ulong)nn] = loopmap[ln];
    nn = nn + 1;
    ln = ln + 1;
  }
  snap->nent = (uint8_t)nn;
  omap = pSVar7 + (ulong)uVar3 + (ulong)(uint)bVar1;
  nmap = pSVar9 + (ulong)uVar5 + (ulong)nn;
  while (omap < pSVar8 + uVar4) {
    *nmap = *omap;
    omap = omap + 1;
    nmap = nmap + 1;
  }
  (J->cur).nsnapmap = (uint16_t)((long)nmap - (long)(J->cur).snapmap >> 2);
  return;
}

Assistant:

static void loop_subst_snap(jit_State *J, SnapShot *osnap,
			    SnapEntry *loopmap, IRRef1 *subst)
{
  SnapEntry *nmap, *omap = &J->cur.snapmap[osnap->mapofs];
  SnapEntry *nextmap = &J->cur.snapmap[snap_nextofs(&J->cur, osnap)];
  MSize nmapofs;
  MSize on, ln, nn, onent = osnap->nent;
  BCReg nslots = osnap->nslots;
  SnapShot *snap = &J->cur.snap[J->cur.nsnap];
  if (irt_isguard(J->guardemit)) {  /* Guard inbetween? */
    nmapofs = J->cur.nsnapmap;
    J->cur.nsnap++;  /* Add new snapshot. */
  } else {  /* Otherwise overwrite previous snapshot. */
    snap--;
    nmapofs = snap->mapofs;
  }
  J->guardemit.irt = 0;
  /* Setup new snapshot. */
  snap->mapofs = (uint16_t)nmapofs;
  snap->ref = (IRRef1)J->cur.nins;
  snap->nslots = nslots;
  snap->topslot = osnap->topslot;
  snap->count = 0;
  nmap = &J->cur.snapmap[nmapofs];
  /* Substitute snapshot slots. */
  on = ln = nn = 0;
  while (on < onent) {
    SnapEntry osn = omap[on], lsn = loopmap[ln];
    if (snap_slot(lsn) < snap_slot(osn)) {  /* Copy slot from loop map. */
      nmap[nn++] = lsn;
      ln++;
    } else {  /* Copy substituted slot from snapshot map. */
      if (snap_slot(lsn) == snap_slot(osn)) ln++;  /* Shadowed loop slot. */
      if (!irref_isk(snap_ref(osn)))
	osn = snap_setref(osn, subst[snap_ref(osn)]);
      nmap[nn++] = osn;
      on++;
    }
  }
  while (snap_slot(loopmap[ln]) < nslots)  /* Copy remaining loop slots. */
    nmap[nn++] = loopmap[ln++];
  snap->nent = (uint8_t)nn;
  omap += onent;
  nmap += nn;
  while (omap < nextmap)  /* Copy PC + frame links. */
    *nmap++ = *omap++;
  J->cur.nsnapmap = (uint16_t)(nmap - J->cur.snapmap);
}